

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O1

void __thiscall xmrig::OclBackend::printHashrate(OclBackend *this,bool details)

{
  uint uVar1;
  pointer pOVar2;
  undefined8 uVar3;
  double dVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  undefined4 extraout_var_01;
  char *pcVar7;
  undefined4 extraout_var_02;
  char *pcVar8;
  undefined4 extraout_var_03;
  char *pcVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000031;
  size_t threadId;
  PciTopology *pPVar10;
  pointer pOVar11;
  char num [24];
  undefined1 local_50 [16];
  char *local_40;
  
  if ((int)CONCAT71(in_register_00000031,details) != 0) {
    iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])();
    if (CONCAT44(extraout_var,iVar5) != 0) {
      num[0] = '\0';
      num[1] = '\0';
      num[2] = '\0';
      num[3] = '\0';
      num[4] = '\0';
      num[5] = '\0';
      num[6] = '\0';
      num[7] = '\0';
      num[8] = '\0';
      num[9] = '\0';
      num[10] = '\0';
      num[0xb] = '\0';
      num[0xc] = '\0';
      num[0xd] = '\0';
      num[0xe] = '\0';
      num[0xf] = '\0';
      num[0x10] = '\0';
      num[0x11] = '\0';
      num[0x12] = '\0';
      num[0x13] = '\0';
      num[0x14] = '\0';
      num[0x15] = '\0';
      num[0x16] = '\0';
      num[0x17] = '\0';
      Log::print("\x1b[1;37m| OPENCL # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");
      pOVar11 = (this->d_ptr->threads).
                super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar2 = (this->d_ptr->threads).
               super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar11 != pOVar2) {
        threadId = 0;
        pPVar10 = &(pOVar11->device).m_topology;
        do {
          uVar3 = *(undefined8 *)(pPVar10 + -0x1b);
          iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
          dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_00,iVar5),threadId,10000);
          pcVar6 = Hashrate::format(dVar4,num,8);
          iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
          dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_01,iVar5),threadId,60000);
          pcVar7 = Hashrate::format(dVar4,num + 8,8);
          iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
          dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_02,iVar5),threadId,900000);
          pcVar8 = Hashrate::format(dVar4,num + 0x10,8);
          uVar1 = *(uint *)(pPVar10 + -2);
          PciTopology::toString((PciTopology *)&local_40);
          pcVar9 = local_40;
          OclDevice::printableName((OclDevice *)local_50);
          Log::print("| %8zu | %8ld | %7s | %7s | %7s |\x1b[1;36m #%u\x1b[0m\x1b[0;33m %s\x1b[0m %s"
                     ,threadId,uVar3,pcVar6,pcVar7,pcVar8,(ulong)uVar1,pcVar9,local_50._0_8_);
          if ((cl_device_id)local_50._0_8_ != (cl_device_id)0x0) {
            operator_delete__((void *)local_50._0_8_);
          }
          if (local_40 != (char *)0x0) {
            operator_delete__(local_40);
          }
          threadId = threadId + 1;
          pOVar11 = (pointer)(pPVar10 + 0x19);
          pPVar10 = pPVar10 + 0x38;
        } while (pOVar11 != pOVar2);
      }
      iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_03,iVar5),10000);
      pcVar9 = Hashrate::format(dVar4,num,8);
      iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_04,iVar5),60000);
      pcVar6 = Hashrate::format(dVar4,num + 8,8);
      iVar5 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar4 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_05,iVar5),900000);
      pcVar7 = Hashrate::format(dVar4,num + 0x10,8);
      Log::print("\x1b[1;37m|        - |        - | %7s | %7s | %7s |",pcVar9,pcVar6,pcVar7);
    }
  }
  return;
}

Assistant:

void xmrig::OclBackend::printHashrate(bool details)
{
    if (!details || !hashrate()) {
        return;
    }

    char num[8 * 3] = { 0 };

    Log::print(WHITE_BOLD_S "| OPENCL # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
         Log::print("| %8zu | %8" PRId64 " | %7s | %7s | %7s |" CYAN_BOLD(" #%u") YELLOW(" %s") " %s",
                    i,
                    data.affinity,
                    Hashrate::format(hashrate()->calc(i, Hashrate::ShortInterval),  num,         sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::MediumInterval), num + 8,     sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3),
                    data.device.index(),
                    data.device.topology().toString().data(),
                    data.device.printableName().data()
                    );

         i++;
    }

    Log::print(WHITE_BOLD_S "|        - |        - | %7s | %7s | %7s |",
               Hashrate::format(hashrate()->calc(Hashrate::ShortInterval),  num,         sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::MediumInterval), num + 8,     sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
               );
}